

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-filepath.cc
# Opt level: O2

FilePath testing::internal::FilePath::GetCurrentDir(void)

{
  char *pcVar1;
  size_t extraout_RDX;
  char *pathname;
  FilePath *in_RDI;
  FilePath FVar2;
  char cwd [4097];
  char acStack_1018 [4104];
  
  memset(acStack_1018,0,0x1001);
  pcVar1 = getcwd(acStack_1018,0x1001);
  pathname = "";
  if (pcVar1 != (char *)0x0) {
    pathname = acStack_1018;
  }
  FilePath(in_RDI,pathname);
  FVar2.pathname_.length_ = extraout_RDX;
  FVar2.pathname_.c_str_ = (char *)in_RDI;
  return (FilePath)FVar2.pathname_;
}

Assistant:

FilePath FilePath::GetCurrentDir() {
#if GTEST_OS_WINDOWS_MOBILE
  // Windows CE doesn't have a current directory, so we just return
  // something reasonable.
  return FilePath(kCurrentDirectoryString);
#elif GTEST_OS_WINDOWS
  char cwd[GTEST_PATH_MAX_ + 1] = { '\0' };
  return FilePath(_getcwd(cwd, sizeof(cwd)) == NULL ? "" : cwd);
#else
  char cwd[GTEST_PATH_MAX_ + 1] = { '\0' };
  return FilePath(getcwd(cwd, sizeof(cwd)) == NULL ? "" : cwd);
#endif  // GTEST_OS_WINDOWS_MOBILE
}